

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *this_02;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr *pp_Var6;
  _Rb_tree_color version;
  _Base_ptr p_Var7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *presets;
  bool bVar8;
  char cVar9;
  ReadFileResult RVar10;
  ExpandMacroResult EVar11;
  uint uVar12;
  undefined4 extraout_EAX;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  undefined8 extraout_RAX;
  iterator iVar17;
  size_type sVar18;
  const_iterator cVar19;
  const_iterator cVar20;
  cmCMakePresetsGraph *pcVar21;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  *this_03;
  byte bVar22;
  WorkflowStep *step;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range2_4;
  _Base_ptr p_Var23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  string binaryDir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  cycleStatus;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  _Any_data local_188;
  undefined1 local_178 [40];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *__range2;
  string installDir;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *__range2_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *__range2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *__range2_1;
  MacroExpander environmentMacroExpander;
  undefined1 local_98 [16];
  code *local_88;
  code *local_80;
  File *file;
  string filename;
  string local_50;
  
  GetUserFilename(&filename,&this->SourceDir);
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inProgressFiles.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = cmsys::SystemTools::FileExists(&filename);
  if (bVar8) {
    pcVar21 = (cmCMakePresetsGraph *)0x0;
    RVar10 = ReadJSONFile(this,&filename,User,Root,&inProgressFiles,&file,&this->errors);
  }
  else {
    GetFilename((string *)&cycleStatus,&this->SourceDir);
    std::__cxx11::string::operator=((string *)&filename,(string *)&cycleStatus);
    std::__cxx11::string::~string((string *)&cycleStatus);
    bVar8 = cmsys::SystemTools::FileExists(&filename);
    if (!bVar8) {
      if (inProgressFiles.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          inProgressFiles.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        RVar10 = (ReadFileResult)!allowNoFiles;
        goto LAB_002c6c39;
      }
      goto LAB_002c79e9;
    }
    pcVar21 = (cmCMakePresetsGraph *)0x0;
    RVar10 = ReadJSONFile(this,&filename,Project,Root,&inProgressFiles,&file,&this->errors);
  }
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  if (inProgressFiles.
      super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      inProgressFiles.
      super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_002c79e9:
    __assert_fail("inProgressFiles.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                  ,0x417,
                  "cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)"
                 );
  }
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __range2 = &this->ConfigurePresets;
  p_Var1 = &(this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = (this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      presets = __range2, (_Rb_tree_header *)p_Var14 != p_Var1;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  for (p_Var14 = (this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var1; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&local_188,&cycleStatus);
    RVar10 = anon_unknown.dwarf_ca301d::VisitPreset<cmCMakePresetsGraph::ConfigurePreset>
                       ((ConfigurePreset *)(p_Var14 + 2),presets,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                         *)&local_188,pcVar21);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            *)&local_188);
    if (RVar10 != READ_OK) goto LAB_002c6244;
  }
  RVar10 = READ_OK;
LAB_002c6244:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->BuildPresets;
  p_Var2 = &(this->BuildPresets)._M_t._M_impl.super__Rb_tree_header;
  pcVar21 = (cmCMakePresetsGraph *)this_00;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var2; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  for (p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var2; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&local_188,&cycleStatus);
    RVar10 = anon_unknown.dwarf_ca301d::VisitPreset<cmCMakePresetsGraph::BuildPreset>
                       ((BuildPreset *)(p_Var14 + 2),this_00,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                         *)&local_188,pcVar21);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            *)&local_188);
    if (RVar10 != READ_OK) goto LAB_002c6309;
  }
  RVar10 = READ_OK;
LAB_002c6309:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->TestPresets;
  p_Var3 = &(this->TestPresets)._M_t._M_impl.super__Rb_tree_header;
  pcVar21 = (cmCMakePresetsGraph *)this_01;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var3; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  for (p_Var14 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var3; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&local_188,&cycleStatus);
    RVar10 = anon_unknown.dwarf_ca301d::VisitPreset<cmCMakePresetsGraph::TestPreset>
                       ((TestPreset *)(p_Var14 + 2),this_01,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                         *)&local_188,pcVar21);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            *)&local_188);
    if (RVar10 != READ_OK) goto LAB_002c63ea;
  }
  RVar10 = READ_OK;
LAB_002c63ea:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_02 = &this->PackagePresets;
  p_Var4 = &(this->PackagePresets)._M_t._M_impl.super__Rb_tree_header;
  pcVar21 = (cmCMakePresetsGraph *)this_02;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var4; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  for (p_Var14 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var4; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&local_188,&cycleStatus);
    RVar10 = anon_unknown.dwarf_ca301d::VisitPreset<cmCMakePresetsGraph::PackagePreset>
                       ((PackagePreset *)(p_Var14 + 2),this_02,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                         *)&local_188,pcVar21);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            *)&local_188);
    if (RVar10 != READ_OK) goto LAB_002c64cb;
  }
  RVar10 = READ_OK;
LAB_002c64cb:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = &(this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var5; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  for (p_Var14 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var5; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           *)&local_188,&cycleStatus);
    RVar10 = anon_unknown.dwarf_ca301d::VisitPreset<cmCMakePresetsGraph::WorkflowPreset>
                       ((WorkflowPreset *)(p_Var14 + 2),&this->WorkflowPresets,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                         *)&local_188,pcVar21);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            *)&local_188);
    if (RVar10 != READ_OK) goto LAB_002c659c;
  }
  RVar10 = READ_OK;
LAB_002c659c:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  if (RVar10 != READ_OK) goto LAB_002c6c39;
  RVar10 = INVALID_MACRO_EXPANSION;
  for (p_Var14 = (this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var1; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pp_Var6 = &p_Var14[0x11]._M_left;
    std::optional<cmCMakePresetsGraph::ConfigurePreset>::
    emplace<cmCMakePresetsGraph::ConfigurePreset_const&>
              ((optional<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6,
               (ConfigurePreset *)(p_Var14 + 2));
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         envCycles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &envCycles._M_t._M_impl.super__Rb_tree_header._M_header;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var15 = p_Var14[0x17]._M_left; p_Var15 != p_Var14 + 0x17;
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[](&envCycles,(key_type *)(p_Var15 + 1));
      *pmVar13 = Unvisited;
    }
    macroExpanders.
    super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    macroExpanders.
    super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    macroExpanders.
    super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80 = std::
               _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
               ::_M_manager;
    environmentMacroExpander.super__Function_base._M_manager = (_Manager_type)0x0;
    environmentMacroExpander._M_invoker = (_Invoker_type)0x0;
    environmentMacroExpander.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    environmentMacroExpander.super__Function_base._M_functor._8_8_ = 0;
    local_98._0_8_ = this;
    local_98._8_8_ = (ConfigurePreset *)(p_Var14 + 2);
    environmentMacroExpander.super__Function_base._M_functor._M_unused._M_object =
         operator_new(0x18);
    *(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
      **)environmentMacroExpander.super__Function_base._M_functor._M_unused._0_8_ = &macroExpanders;
    *(_Base_ptr **)
     ((long)environmentMacroExpander.super__Function_base._M_functor._M_unused._0_8_ + 8) = pp_Var6;
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      **)((long)environmentMacroExpander.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &envCycles;
    environmentMacroExpander._M_invoker =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_invoke;
    environmentMacroExpander.super__Function_base._M_manager =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_manager;
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back(&macroExpanders,(value_type *)local_98);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back(&macroExpanders,&environmentMacroExpander);
    for (p_Var16 = p_Var14[0x17]._M_left; p_Var16 != p_Var14 + 0x17;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      if ((char)p_Var16[3]._M_color == _S_black) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::operator[](&envCycles,(key_type *)(p_Var16 + 1));
        EVar11 = anon_unknown.dwarf_ca301d::VisitEnv
                           ((string *)(p_Var16 + 2),pmVar13,&macroExpanders,
                            p_Var14[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) {
          std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                    ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
          std::_Function_base::~_Function_base(&environmentMacroExpander.super__Function_base);
          std::_Function_base::~_Function_base((_Function_base *)local_98);
          std::
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          ::~vector(&macroExpanders);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&envCycles);
          goto LAB_002c6bf8;
        }
        if (EVar11 == Error) {
          std::_Function_base::~_Function_base(&environmentMacroExpander.super__Function_base);
          std::_Function_base::~_Function_base((_Function_base *)local_98);
          std::
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          ::~vector(&macroExpanders);
          this_03 = &envCycles;
          goto LAB_002c6c34;
        }
      }
    }
    p_Var15 = p_Var14[6]._M_left;
    if (p_Var15 == (_Base_ptr)0x0) {
LAB_002c67c6:
      std::__cxx11::string::string((string *)&binaryDir,(string *)&p_Var14[0xd]._M_parent);
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         (&binaryDir,&macroExpanders,p_Var14[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) {
        std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                  ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
        p_Var16 = (_Rb_tree_node_base *)0x1;
      }
      else if (EVar11 == Error) {
        p_Var16 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var16 = p_Var14;
        if (binaryDir._M_string_length != 0) {
          bVar8 = cmsys::SystemTools::FileIsFullPath(&binaryDir);
          if (!bVar8) {
            cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (this->SourceDir)._M_dataplus._M_p;
            cycleStatus._M_t._M_impl._0_8_ = (this->SourceDir)._M_string_length;
            local_188._M_unused._M_member_pointer = 1;
            local_188._8_8_ = local_178;
            local_178[0] = 0x2f;
            cmStrCat<std::__cxx11::string>
                      (&installDir,(cmAlphaNum *)&cycleStatus,(cmAlphaNum *)&local_188,&binaryDir);
            std::__cxx11::string::operator=((string *)&binaryDir,(string *)&installDir);
            std::__cxx11::string::~string((string *)&installDir);
          }
          p_Var16 = (_Rb_tree_node_base *)&cycleStatus;
          cmsys::SystemTools::CollapseFullPath((string *)p_Var16,&binaryDir);
          std::__cxx11::string::operator=((string *)&p_Var14[0x1c]._M_right,(string *)p_Var16);
          std::__cxx11::string::~string((string *)p_Var16);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)&p_Var14[0x1c]._M_right);
        }
        if (p_Var14[0xe]._M_left != (_Base_ptr)0x0) {
          std::__cxx11::string::string((string *)&installDir,(string *)&p_Var14[0xe]._M_parent);
          EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                             (&installDir,&macroExpanders,p_Var14[4]._M_parent[1]._M_color);
          if (EVar11 == Ignore) {
            std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
            local_178._32_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            bVar8 = false;
          }
          else if (EVar11 == Error) {
            bVar8 = false;
            local_178._32_8_ = local_178._32_8_ & 0xffffffff00000000;
          }
          else {
            bVar8 = cmsys::SystemTools::FileIsFullPath(&installDir);
            if (!bVar8) {
              cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   (this->SourceDir)._M_dataplus._M_p;
              cycleStatus._M_t._M_impl._0_8_ = (this->SourceDir)._M_string_length;
              local_188._M_unused._M_member_pointer = 1;
              local_188._8_8_ = local_178;
              local_178[0] = 0x2f;
              cmStrCat<std::__cxx11::string>
                        (&local_50,(cmAlphaNum *)&cycleStatus,(cmAlphaNum *)&local_188,&installDir);
              std::__cxx11::string::operator=((string *)&installDir,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
            cmsys::SystemTools::CollapseFullPath((string *)&cycleStatus,&installDir);
            std::__cxx11::string::operator=
                      ((string *)&p_Var14[0x1d]._M_right,(string *)&cycleStatus);
            std::__cxx11::string::~string((string *)&cycleStatus);
            bVar8 = true;
            cmsys::SystemTools::ConvertToUnixSlashes((string *)&p_Var14[0x1d]._M_right);
            local_178._32_4_ = extraout_EAX;
          }
          std::__cxx11::string::~string((string *)&installDir);
          p_Var16 = (_Rb_tree_node_base *)(local_178._32_8_ & 0xffffffff);
          if (!bVar8) goto LAB_002c6bb6;
        }
        if (p_Var14[0xc]._M_left != (_Base_ptr)0x0) {
          local_178._32_4_ = (int)p_Var16;
          std::__cxx11::string::string((string *)&cycleStatus,(string *)&p_Var14[0xc]._M_parent);
          EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                             ((string *)&cycleStatus,&macroExpanders,
                              p_Var14[4]._M_parent[1]._M_color);
          p_Var16 = (_Rb_tree_node_base *)(local_178._32_8_ & 0xffffffff);
          if (EVar11 == Ignore) {
            std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
            p_Var16 = (_Rb_tree_node_base *)0x1;
            bVar8 = false;
          }
          else if (EVar11 == Error) {
            bVar8 = false;
            p_Var16 = (_Rb_tree_node_base *)0x0;
          }
          else {
            bVar8 = true;
            std::__cxx11::string::_M_assign((string *)&p_Var14[0x1b]._M_right);
          }
          std::__cxx11::string::~string((string *)&cycleStatus);
          if (!bVar8) goto LAB_002c6bb6;
        }
        bVar22 = (byte)p_Var16;
        for (p_Var16 = p_Var14[0x1f]._M_left; p_Var16 != p_Var14 + 0x1f;
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
          if ((char)p_Var16[4]._M_color == _S_black) {
            EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                               ((string *)(p_Var16 + 3),&macroExpanders,
                                p_Var14[4]._M_parent[1]._M_color);
            if (EVar11 == Ignore) {
              std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                        ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
              p_Var16 = (_Rb_tree_node_base *)0x1;
              goto LAB_002c6bb6;
            }
            if (EVar11 == Error) {
              bVar22 = 0;
              break;
            }
          }
        }
        p_Var16 = (_Rb_tree_node_base *)(ulong)(bVar22 | p_Var16 == p_Var14 + 0x1f);
      }
LAB_002c6bb6:
      std::__cxx11::string::~string((string *)&binaryDir);
    }
    else {
      cycleStatus._M_t._M_impl._1_1_ = 0;
      uVar12 = (**(code **)(*(long *)p_Var15 + 0x10))
                         (p_Var15,&macroExpanders,p_Var14[4]._M_parent[1]._M_color,&cycleStatus);
      p_Var16 = (_Rb_tree_node_base *)(ulong)uVar12;
      if ((char)uVar12 != '\0') {
        if (cycleStatus._M_t._M_impl._1_1_ != '\0') {
          *(undefined1 *)&p_Var14[0x16]._M_left = cycleStatus._M_t._M_impl._0_1_;
          goto LAB_002c67c6;
        }
        std::_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>::_M_reset
                  ((_Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var6);
      }
    }
    std::_Function_base::~_Function_base(&environmentMacroExpander.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)local_98);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::~vector(&macroExpanders);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map(&envCycles);
    if (((ulong)p_Var16 & 1) == 0) goto LAB_002c6c39;
LAB_002c6bf8:
  }
  p_Var14 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002c6c70:
  if ((_Rb_tree_header *)p_Var14 != p_Var2) {
    if ((char)p_Var14[4]._M_color == _S_red) {
      iVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&__range2->_M_t,(key_type *)&p_Var14[8]._M_right);
      if ((_Rb_tree_header *)iVar17._M_node == p_Var1) goto LAB_002c79dd;
      sVar18 = std::
               _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&p_Var14[4]._M_parent[1]._M_parent,
                       (key_type *)&iVar17._M_node[4]._M_parent);
      if (sVar18 == 0) goto LAB_002c79e1;
      if ((*(char *)((long)&p_Var14[9]._M_right + 1) != '\x01') ||
         (((ulong)p_Var14[9]._M_right & 1) != 0)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
        ::
        _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                    *)&p_Var14[7]._M_parent,iVar17._M_node[8],
                   (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )&iVar17._M_node[7]._M_left);
      }
    }
    pp_Var6 = &p_Var14[0xd]._M_parent;
    std::optional<cmCMakePresetsGraph::BuildPreset>::
    emplace<cmCMakePresetsGraph::BuildPreset_const&>
              ((optional<cmCMakePresetsGraph::BuildPreset> *)pp_Var6,(BuildPreset *)(p_Var14 + 2));
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var15 = p_Var14[0x13]._M_parent; p_Var15 != (_Base_ptr)&p_Var14[0x12]._M_right;
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[](&cycleStatus,(key_type *)(p_Var15 + 1));
      *pmVar13 = Unvisited;
    }
    binaryDir.field_2._M_allocated_capacity = 0;
    binaryDir._M_dataplus._M_p = (pointer)0x0;
    binaryDir._M_string_length = 0;
    local_178._8_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_invoke;
    local_178._0_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_manager;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    envCycles._M_t._M_impl._0_8_ = 0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_188._M_unused._M_object = this;
    local_188._8_8_ = (TestPreset *)(p_Var14 + 2);
    envCycles._M_t._M_impl._0_8_ = operator_new(0x18);
    *(string **)envCycles._M_t._M_impl._0_8_ = &binaryDir;
    *(_Base_ptr **)(envCycles._M_t._M_impl._0_8_ + 8) = pp_Var6;
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      **)(envCycles._M_t._M_impl._0_8_ + 0x10) = &cycleStatus;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_invoke;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_manager;
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&local_188);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&envCycles);
    for (p_Var15 = p_Var14[0x13]._M_parent; p_Var15 != (_Base_ptr)&p_Var14[0x12]._M_right;
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
      if ((char)p_Var15[3]._M_color == _S_black) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::operator[](&cycleStatus,(key_type *)(p_Var15 + 1));
        EVar11 = anon_unknown.dwarf_ca301d::VisitEnv
                           ((string *)(p_Var15 + 2),pmVar13,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var14[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c6fab;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
    }
    p_Var15 = p_Var14[6]._M_left;
    if (p_Var15 == (_Base_ptr)0x0) {
LAB_002c6edc:
      p_Var7 = p_Var14[0x15]._M_right;
      for (p_Var15 = p_Var14[0x15]._M_left; p_Var15 != p_Var7; p_Var15 = p_Var15 + 1) {
        EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                           ((string *)p_Var15,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var14[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c6fab;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
      p_Var7 = p_Var14[0x17]._M_right;
      for (p_Var15 = p_Var14[0x17]._M_left; p_Var15 != p_Var7; p_Var15 = p_Var15 + 1) {
        EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                           ((string *)p_Var15,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var14[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c6fab;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
      goto LAB_002c6fba;
    }
    installDir._M_dataplus._M_p._1_1_ = '\0';
    cVar9 = (**(code **)(*(long *)p_Var15 + 0x10))
                      (p_Var15,&binaryDir,p_Var14[4]._M_parent[1]._M_color,&installDir);
    if (cVar9 != '\0') {
      if (installDir._M_dataplus._M_p._1_1_ != '\0') {
        *(undefined1 *)&p_Var14[0x12]._M_parent = installDir._M_dataplus._M_p._0_1_;
        goto LAB_002c6edc;
      }
      std::_Optional_payload_base<cmCMakePresetsGraph::BuildPreset>::_M_reset
                ((_Optional_payload_base<cmCMakePresetsGraph::BuildPreset> *)pp_Var6);
      std::_Function_base::~_Function_base((_Function_base *)&envCycles);
      std::_Function_base::~_Function_base((_Function_base *)&local_188);
      std::
      vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
      ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::~map(&cycleStatus);
      goto LAB_002c6fe8;
    }
    goto LAB_002c7dfb;
  }
  p_Var16 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002c7004:
  if ((_Rb_tree_header *)p_Var16 == p_Var3) goto LAB_002c75b8;
  if ((char)p_Var16[4]._M_color == _S_red) {
    iVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
             ::find(&__range2->_M_t,(key_type *)&p_Var16[8]._M_right);
    if ((_Rb_tree_header *)iVar17._M_node == p_Var1) goto LAB_002c79dd;
    sVar18 = std::
             _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&p_Var16[4]._M_parent[1]._M_parent,(key_type *)&iVar17._M_node[4]._M_parent)
    ;
    if (sVar18 == 0) goto LAB_002c79e1;
    if ((*(char *)((long)&p_Var16[9]._M_right + 1) != '\x01') ||
       (((ulong)p_Var16[9]._M_right & 1) != 0)) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
      ::
      _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                  *)&p_Var16[7]._M_parent,iVar17._M_node[8],
                 (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&iVar17._M_node[7]._M_left);
    }
  }
  pp_Var6 = &p_Var16[0x1e]._M_parent;
  std::optional<cmCMakePresetsGraph::TestPreset>::emplace<cmCMakePresetsGraph::TestPreset_const&>
            ((optional<cmCMakePresetsGraph::TestPreset> *)pp_Var6,(TestPreset *)(p_Var16 + 2));
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var14 = p_Var16[0x24]._M_parent; p_Var14 != (_Base_ptr)&p_Var16[0x23]._M_right;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
    *pmVar13 = Unvisited;
  }
  binaryDir.field_2._M_allocated_capacity = 0;
  binaryDir._M_dataplus._M_p = (pointer)0x0;
  binaryDir._M_string_length = 0;
  local_178._8_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_invoke;
  local_178._0_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_manager;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  envCycles._M_t._M_impl._0_8_ = 0;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_188._M_unused._M_object = this;
  local_188._8_8_ = (TestPreset *)(p_Var16 + 2);
  envCycles._M_t._M_impl._0_8_ = operator_new(0x18);
  *(string **)envCycles._M_t._M_impl._0_8_ = &binaryDir;
  *(_Base_ptr **)(envCycles._M_t._M_impl._0_8_ + 8) = pp_Var6;
  *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    **)(envCycles._M_t._M_impl._0_8_ + 0x10) = &cycleStatus;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_invoke;
  envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_manager;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&binaryDir,(value_type *)&local_188);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&binaryDir,(value_type *)&envCycles);
  for (p_Var14 = p_Var16[0x24]._M_parent; p_Var14 != (_Base_ptr)&p_Var16[0x23]._M_right;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    if ((char)p_Var14[3]._M_color == _S_black) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
      EVar11 = anon_unknown.dwarf_ca301d::VisitEnv
                         ((string *)(p_Var14 + 2),pmVar13,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
    }
  }
  p_Var14 = p_Var16[6]._M_left;
  if (p_Var14 == (_Base_ptr)0x0) {
LAB_002c72a0:
    p_Var15 = p_Var16[0x27]._M_left;
    for (p_Var14 = p_Var16[0x27]._M_parent; p_Var14 != p_Var15; p_Var14 = p_Var14 + 1) {
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)p_Var14,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
    }
    if ((char)p_Var16[0x2c]._M_color == _S_black) {
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x28]._M_right,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x29]._M_right,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 != Ignore) {
        if (EVar11 != Error) goto LAB_002c7359;
        goto LAB_002c7dfb;
      }
    }
    else {
LAB_002c7359:
      if ((char)p_Var16[0x37]._M_color != _S_black) goto LAB_002c7537;
      if (*(char *)&p_Var16[0x31]._M_parent != '\x01') goto LAB_002c7421;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x2c]._M_parent,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x2d]._M_parent,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
      if (*(char *)&p_Var16[0x30]._M_right == '\x01') {
        EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                           ((string *)&p_Var16[0x2f]._M_right,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c7574;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
LAB_002c7421:
      if (*(char *)&p_Var16[0x36]._M_right != '\x01') {
LAB_002c7537:
        if (*(char *)&p_Var16[0x3a]._M_parent == '\x01') {
          EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                             ((string *)&p_Var16[0x37]._M_right,
                              (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                               *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
          if (EVar11 == Ignore) goto LAB_002c7574;
          if (EVar11 == Error) goto LAB_002c7dfb;
        }
        goto LAB_002c757e;
      }
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x31]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7574;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x32]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 != Ignore) {
        if (EVar11 == Error) goto LAB_002c7dfb;
        if (*(char *)&p_Var16[0x36]._M_left != '\x01') goto LAB_002c7537;
        EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                           ((string *)&p_Var16[0x33]._M_left,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
        if (EVar11 != Ignore) {
          if (EVar11 == Error) goto LAB_002c7dfb;
          EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                             ((string *)&p_Var16[0x34]._M_left,
                              (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                               *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
          if (EVar11 != Ignore) {
            if (EVar11 == Error) goto LAB_002c7dfb;
            EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                               ((string *)&p_Var16[0x35]._M_left,
                                (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                 *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
            if (EVar11 != Ignore) {
              if (EVar11 != Error) goto LAB_002c7537;
              goto LAB_002c7dfb;
            }
          }
        }
      }
    }
  }
  else {
    installDir._M_dataplus._M_p._1_1_ = '\0';
    cVar9 = (**(code **)(*(long *)p_Var14 + 0x10))
                      (p_Var14,&binaryDir,p_Var16[4]._M_parent[1]._M_color,&installDir);
    if (cVar9 == '\0') goto LAB_002c7dfb;
    if (installDir._M_dataplus._M_p._1_1_ != '\0') {
      *(undefined1 *)&p_Var16[0x23]._M_parent = installDir._M_dataplus._M_p._0_1_;
      goto LAB_002c72a0;
    }
  }
LAB_002c7574:
  std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset>::_M_reset
            ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset> *)pp_Var6);
LAB_002c757e:
  std::_Function_base::~_Function_base((_Function_base *)&envCycles);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&binaryDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
  p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
  goto LAB_002c7004;
LAB_002c6fab:
  std::_Optional_payload_base<cmCMakePresetsGraph::BuildPreset>::_M_reset
            ((_Optional_payload_base<cmCMakePresetsGraph::BuildPreset> *)pp_Var6);
LAB_002c6fba:
  std::_Function_base::~_Function_base((_Function_base *)&envCycles);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&binaryDir);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(&cycleStatus);
LAB_002c6fe8:
  p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
  goto LAB_002c6c70;
LAB_002c79dd:
  RVar10 = INVALID_CONFIGURE_PRESET;
  goto LAB_002c6c39;
LAB_002c79e1:
  RVar10 = CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
  goto LAB_002c6c39;
LAB_002c7dfb:
  std::_Function_base::~_Function_base((_Function_base *)&envCycles);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&binaryDir);
  this_03 = &cycleStatus;
LAB_002c6c34:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map(this_03);
  goto LAB_002c6c39;
LAB_002c75b8:
  for (p_Var16 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != p_Var4;
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
    if ((char)p_Var16[4]._M_color == _S_red) {
      iVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&__range2->_M_t,(key_type *)&p_Var16[8]._M_right);
      if ((_Rb_tree_header *)iVar17._M_node == p_Var1) goto LAB_002c79dd;
      sVar18 = std::
               _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&p_Var16[4]._M_parent[1]._M_parent,
                       (key_type *)&iVar17._M_node[4]._M_parent);
      if (sVar18 == 0) goto LAB_002c79e1;
      if ((*(char *)((long)&p_Var16[9]._M_right + 1) != '\x01') ||
         (((ulong)p_Var16[9]._M_right & 1) != 0)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
        ::
        _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                    *)&p_Var16[7]._M_parent,iVar17._M_node[8],
                   (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )&iVar17._M_node[7]._M_left);
      }
    }
    pp_Var6 = &p_Var16[0x12]._M_parent;
    std::optional<cmCMakePresetsGraph::PackagePreset>::
    emplace<cmCMakePresetsGraph::PackagePreset_const&>
              ((optional<cmCMakePresetsGraph::PackagePreset> *)pp_Var6,
               (PackagePreset *)(p_Var16 + 2));
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var14 = p_Var16[0x18]._M_parent; p_Var14 != (_Base_ptr)&p_Var16[0x17]._M_right;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
      *pmVar13 = Unvisited;
    }
    binaryDir.field_2._M_allocated_capacity = 0;
    binaryDir._M_dataplus._M_p = (pointer)0x0;
    binaryDir._M_string_length = 0;
    local_178._8_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_invoke;
    local_178._0_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_manager;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    envCycles._M_t._M_impl._0_8_ = 0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_188._M_unused._M_object = this;
    local_188._8_8_ = (TestPreset *)(p_Var16 + 2);
    envCycles._M_t._M_impl._0_8_ = operator_new(0x18);
    *(string **)envCycles._M_t._M_impl._0_8_ = &binaryDir;
    *(_Base_ptr **)(envCycles._M_t._M_impl._0_8_ + 8) = pp_Var6;
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      **)(envCycles._M_t._M_impl._0_8_ + 0x10) = &cycleStatus;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_invoke;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_manager;
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&local_188);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&envCycles);
    for (p_Var14 = p_Var16[0x18]._M_parent; p_Var14 != (_Base_ptr)&p_Var16[0x17]._M_right;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      if ((char)p_Var14[3]._M_color == _S_black) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
        EVar11 = anon_unknown.dwarf_ca301d::VisitEnv
                           ((string *)(p_Var14 + 2),pmVar13,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c7999;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
    }
    p_Var14 = p_Var16[6]._M_left;
    if (p_Var14 == (_Base_ptr)0x0) {
LAB_002c7860:
      for (p_Var14 = p_Var16[0x1c]._M_left; version = p_Var16[4]._M_parent[1]._M_color,
          p_Var14 != p_Var16 + 0x1c; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
        EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                           ((string *)(p_Var14 + 2),
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,version);
        if (EVar11 == Ignore) goto LAB_002c7999;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x1d]._M_parent,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,version);
      if (EVar11 == Ignore) goto LAB_002c7999;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x1e]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7999;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x1f]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7999;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x20]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7999;
      if (EVar11 == Error) goto LAB_002c7dfb;
      EVar11 = anon_unknown.dwarf_ca301d::ExpandMacros
                         ((string *)&p_Var16[0x21]._M_left,
                          (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                           *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
      if (EVar11 == Ignore) goto LAB_002c7999;
      if (EVar11 == Error) goto LAB_002c7dfb;
    }
    else {
      installDir._M_dataplus._M_p._1_1_ = '\0';
      cVar9 = (**(code **)(*(long *)p_Var14 + 0x10))
                        (p_Var14,&binaryDir,p_Var16[4]._M_parent[1]._M_color,&installDir);
      if (cVar9 == '\0') goto LAB_002c7dfb;
      if (installDir._M_dataplus._M_p._1_1_ != '\0') {
        *(undefined1 *)&p_Var16[0x17]._M_parent = installDir._M_dataplus._M_p._0_1_;
        goto LAB_002c7860;
      }
LAB_002c7999:
      std::_Optional_payload_base<cmCMakePresetsGraph::PackagePreset>::_M_reset
                ((_Optional_payload_base<cmCMakePresetsGraph::PackagePreset> *)pp_Var6);
    }
    std::_Function_base::~_Function_base((_Function_base *)&envCycles);
    std::_Function_base::~_Function_base((_Function_base *)&local_188);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&binaryDir);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map(&cycleStatus);
  }
  for (p_Var16 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != p_Var5;
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
    local_178._32_8_ = p_Var16 + 2;
    p_Var15 = *(_Base_ptr *)(p_Var16 + 9);
    p_Var23 = (_Base_ptr)0x0;
    for (p_Var14 = p_Var16[8]._M_right; p_Var14 != p_Var15;
        p_Var14 = (_Base_ptr)&p_Var14[1]._M_parent) {
      if ((p_Var14->_M_color == _S_red) != (p_Var23 == (_Base_ptr)0x0)) goto LAB_002c7e26;
      switch(p_Var14->_M_color) {
      case _S_red:
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                 ::find(&__range2->_M_t,(key_type *)&p_Var14->_M_parent);
        if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
          sVar18 = std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)&p_Var16[4]._M_parent[1]._M_parent,
                           (key_type *)&cVar19._M_node[4]._M_parent);
          if (sVar18 != 0) {
            p_Var23 = cVar19._M_node + 2;
            goto switchD_002c7a8e_default;
          }
          goto LAB_002c7e2d;
        }
        goto LAB_002c7e26;
      case _S_black:
        cVar20._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::find(&this_00->_M_t,(key_type *)&p_Var14->_M_parent);
        if ((_Rb_tree_header *)cVar20._M_node == p_Var2) goto LAB_002c7e26;
        sVar18 = std::
                 _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&p_Var16[4]._M_parent[1]._M_parent,
                         (key_type *)&cVar20._M_node[4]._M_parent);
        break;
      case 2:
        cVar20._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
             ::find(&this_01->_M_t,(key_type *)&p_Var14->_M_parent);
        if ((_Rb_tree_header *)cVar20._M_node == p_Var3) goto LAB_002c7e26;
        sVar18 = std::
                 _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&p_Var16[4]._M_parent[1]._M_parent,
                         (key_type *)&cVar20._M_node[4]._M_parent);
        break;
      case 3:
        cVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                 ::find(&this_02->_M_t,(key_type *)&p_Var14->_M_parent);
        if ((_Rb_tree_header *)cVar20._M_node == p_Var4) goto LAB_002c7e26;
        sVar18 = std::
                 _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&p_Var16[4]._M_parent[1]._M_parent,
                         (key_type *)&cVar20._M_node[4]._M_parent);
        break;
      default:
        goto switchD_002c7a8e_default;
      }
      if (sVar18 == 0) {
LAB_002c7e2d:
        RVar10 = WORKFLOW_STEP_UNREACHABLE_FROM_FILE;
        goto LAB_002c6c39;
      }
      bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cVar20._M_node[8]._M_right,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var23->_M_parent);
      if (bVar8) goto LAB_002c7e26;
switchD_002c7a8e_default:
    }
    if (p_Var23 == (_Base_ptr)0x0) {
LAB_002c7e26:
      RVar10 = INVALID_WORKFLOW_STEPS;
      goto LAB_002c6c39;
    }
    pp_Var6 = &p_Var16[9]._M_left;
    std::optional<cmCMakePresetsGraph::WorkflowPreset>::
    emplace<cmCMakePresetsGraph::WorkflowPreset_const&>
              ((optional<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var6,
               (WorkflowPreset *)local_178._32_8_);
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cycleStatus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var14 = p_Var16[0xf]._M_left; p_Var14 != p_Var16 + 0xf;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
      *pmVar13 = Unvisited;
    }
    binaryDir.field_2._M_allocated_capacity = 0;
    binaryDir._M_dataplus._M_p = (pointer)0x0;
    binaryDir._M_string_length = 0;
    local_188._8_8_ = local_178._32_8_;
    local_178._8_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_invoke;
    local_178._0_8_ =
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
         ::_M_manager;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    envCycles._M_t._M_impl._0_8_ = 0;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_188._M_unused._M_object = this;
    envCycles._M_t._M_impl._0_8_ = operator_new(0x18);
    *(string **)envCycles._M_t._M_impl._0_8_ = &binaryDir;
    *(_Base_ptr **)(envCycles._M_t._M_impl._0_8_ + 8) = pp_Var6;
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      **)(envCycles._M_t._M_impl._0_8_ + 0x10) = &cycleStatus;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_invoke;
    envCycles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         std::
         _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
         ::_M_manager;
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&local_188);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 *)&binaryDir,(value_type *)&envCycles);
    for (p_Var14 = p_Var16[0xf]._M_left; p_Var14 != p_Var16 + 0xf;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      if ((char)p_Var14[3]._M_color == _S_black) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::operator[](&cycleStatus,(key_type *)(p_Var14 + 1));
        EVar11 = anon_unknown.dwarf_ca301d::VisitEnv
                           ((string *)(p_Var14 + 2),pmVar13,
                            (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                             *)&binaryDir,p_Var16[4]._M_parent[1]._M_color);
        if (EVar11 == Ignore) goto LAB_002c7db7;
        if (EVar11 == Error) goto LAB_002c7dfb;
      }
    }
    p_Var14 = p_Var16[6]._M_left;
    if (p_Var14 != (_Base_ptr)0x0) {
      installDir._M_dataplus._M_p._1_1_ = '\0';
      cVar9 = (**(code **)(*(long *)p_Var14 + 0x10))
                        (p_Var14,&binaryDir,p_Var16[4]._M_parent[1]._M_color,&installDir);
      if (cVar9 == '\0') goto LAB_002c7dfb;
      if (installDir._M_dataplus._M_p._1_1_ == '\0') {
LAB_002c7db7:
        std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                  ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var6);
      }
      else {
        *(undefined1 *)&p_Var16[0xe]._M_left = installDir._M_dataplus._M_p._0_1_;
      }
    }
    std::_Function_base::~_Function_base((_Function_base *)&envCycles);
    std::_Function_base::~_Function_base((_Function_base *)&local_188);
    std::
    vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&binaryDir);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::~map(&cycleStatus);
  }
  RVar10 = READ_OK;
LAB_002c6c39:
  std::_Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::
  ~_Vector_base(&inProgressFiles.
                 super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
               );
  std::__cxx11::string::~string((string *)&filename);
  return RVar10;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    auto result =
      this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                         inProgressFiles, file, this->errors);
    if (result != ReadFileResult::READ_OK) {
      return result;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      auto result =
        this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                           inProgressFiles, file, this->errors);
      if (result != ReadFileResult::READ_OK) {
        return result;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    return allowNoFiles ? ReadFileResult::READ_OK
                        : ReadFileResult::FILE_NOT_FOUND;
  }

  CHECK_OK(ComputePresetInheritance(this->ConfigurePresets, *this));
  CHECK_OK(ComputePresetInheritance(this->BuildPresets, *this));
  CHECK_OK(ComputePresetInheritance(this->TestPresets, *this));
  CHECK_OK(ComputePresetInheritance(this->PackagePresets, *this));
  CHECK_OK(ComputePresetInheritance(this->WorkflowPresets, *this));

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        return ReadFileResult::INVALID_WORKFLOW_STEPS;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        return ReadFileResult::INVALID_WORKFLOW_STEPS;
      }

      ReadFileResult result;
      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset);
          break;
        case Type::Test:
          result =
            TryReachPresetFromWorkflow(it.second.Unexpanded, this->TestPresets,
                                       step.PresetName, configurePreset);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset);
          break;
      }
      if (result != ReadFileResult::READ_OK) {
        return result;
      }
    }

    if (configurePreset == nullptr) {
      return ReadFileResult::INVALID_WORKFLOW_STEPS;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  return ReadFileResult::READ_OK;
}